

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O0

double Js::Math::Log2(double x,ScriptContext *scriptContext)

{
  double dVar1;
  ScriptContext *scriptContext_local;
  double x_local;
  
  dVar1 = log2(x);
  return dVar1;
}

Assistant:

double Math::Log2(double x, ScriptContext* scriptContext)
    {
#if defined(WHEN_UCRT_IS_LINKED_IN_BUILD) || !defined(_WIN32)
        return ::log2( x );
#else
        // TODO: THE FALLBACK IS NOT ACCURATE; Universal CRT is available on Threshold so we should never fallback but ideally we would link at build time to these APIs instead of loading them at runtime
        UCrtC99MathApis* ucrtC99MathApis = scriptContext->GetThreadContext()->GetUCrtC99MathApis();
        return ucrtC99MathApis->IsAvailable() ?
            ucrtC99MathApis->log2(x) :
            Math::Log( x ) / Math::LN2;
#endif
    }